

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

void __thiscall absl::Mutex::Unlock(Mutex *this)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  
  DebugOnlyLockLeave(this);
  uVar1 = (this->mu_).super___atomic_base<long>._M_i;
  uVar2 = (uint)uVar1;
  if ((uVar2 & 9) != 8) {
    raw_log_internal::RawLog
              (kFatal,"mutex.cc",0x6ad,"Mutex unlocked when destroyed or not locked: v=0x%x",
               uVar1 & 0xffffffff);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/synchronization/mutex.cc"
                  ,0x6ad,"void absl::Mutex::Unlock()");
  }
  uVar4 = uVar2 & 0x10;
  uVar3 = (ulong)(uVar2 & 6) ^ 4;
  if (((ulong)(uVar2 & 6) == 4 || (uVar2 & 0x18) != 8) == uVar4 < uVar3) {
    raw_log_internal::RawLog
              (kFatal,"mutex.cc",0x6c2,"internal logic error %llx %llx %llx\n",uVar1,(ulong)uVar4,
               uVar3);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/synchronization/mutex.cc"
                  ,0x6c2,"void absl::Mutex::Unlock()");
  }
  if (uVar4 < (uint)uVar3) {
    LOCK();
    bVar5 = uVar1 == (this->mu_).super___atomic_base<long>._M_i;
    if (bVar5) {
      (this->mu_).super___atomic_base<long>._M_i = uVar1 & 0xffffffffffffffd6;
    }
    UNLOCK();
    if (bVar5) {
      return;
    }
  }
  UnlockSlow(this,(SynchWaitParams *)0x0);
  return;
}

Assistant:

void Mutex::Unlock() {
  ABSL_TSAN_MUTEX_PRE_UNLOCK(this, 0);
  DebugOnlyLockLeave(this);
  intptr_t v = mu_.load(std::memory_order_relaxed);

  if (kDebugMode && ((v & (kMuWriter | kMuReader)) != kMuWriter)) {
    ABSL_RAW_LOG(FATAL, "Mutex unlocked when destroyed or not locked: v=0x%x",
                 static_cast<unsigned>(v));
  }

  // should_try_cas is whether we'll try a compare-and-swap immediately.
  // NOTE: optimized out when kDebugMode is false.
  bool should_try_cas = ((v & (kMuEvent | kMuWriter)) == kMuWriter &&
                         (v & (kMuWait | kMuDesig)) != kMuWait);
  // But, we can use an alternate computation of it, that compilers
  // currently don't find on their own.  When that changes, this function
  // can be simplified.
  intptr_t x = (v ^ (kMuWriter | kMuWait)) & (kMuWriter | kMuEvent);
  intptr_t y = (v ^ (kMuWriter | kMuWait)) & (kMuWait | kMuDesig);
  // Claim: "x == 0 && y > 0" is equal to should_try_cas.
  // Also, because kMuWriter and kMuEvent exceed kMuDesig and kMuWait,
  // all possible non-zero values for x exceed all possible values for y.
  // Therefore, (x == 0 && y > 0) == (x < y).
  if (kDebugMode && should_try_cas != (x < y)) {
    // We would usually use PRIdPTR here, but is not correctly implemented
    // within the android toolchain.
    ABSL_RAW_LOG(FATAL, "internal logic error %llx %llx %llx\n",
                 static_cast<long long>(v), static_cast<long long>(x),
                 static_cast<long long>(y));
  }
  if (x < y && mu_.compare_exchange_strong(v, v & ~(kMuWrWait | kMuWriter),
                                           std::memory_order_release,
                                           std::memory_order_relaxed)) {
    // fast writer release (writer with no waiters or with designated waker)
  } else {
    this->UnlockSlow(nullptr /*no waitp*/);  // take slow path
  }
  ABSL_TSAN_MUTEX_POST_UNLOCK(this, 0);
}